

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O2

int run_test_udp_send_unix(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  char *pcVar4;
  uv_buf_t buf;
  undefined1 local_296 [18];
  undefined8 local_284;
  undefined8 uStack_27c;
  undefined8 local_274;
  undefined8 uStack_26c;
  undefined8 local_264;
  undefined8 uStack_25c;
  undefined8 local_254;
  undefined8 uStack_24c;
  undefined8 local_244;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined8 uStack_230;
  uv_udp_t handle;
  uv_udp_send_t req;
  
  buf = (uv_buf_t)uv_buf_init("PING",4);
  uVar3 = uv_default_loop();
  uStack_27c = 0;
  local_274 = 0;
  uStack_26c = 0;
  local_264 = 0;
  uStack_25c = 0;
  local_254 = 0;
  uStack_24c = 0;
  local_244 = 0;
  uStack_23c = 0;
  uStack_238 = 0;
  uStack_234 = 0;
  uStack_230 = 0;
  local_296._0_2_ = 1;
  local_296[2] = '/';
  local_296[3] = 't';
  local_296[4] = 'm';
  local_296[5] = 'p';
  local_296[6] = '/';
  local_296[7] = 'u';
  local_296[8] = 'v';
  local_296[9] = '-';
  local_296[10] = 't';
  local_296[0xb] = 'e';
  local_296[0xc] = 's';
  local_296[0xd] = 't';
  local_296[0xe] = '-';
  local_296[0xf] = 's';
  local_296[0x10] = 'o';
  local_296[0x11] = 'c';
  local_284 = 0x6b;
  iVar1 = socket(1,1,0);
  if (iVar1 < 0) {
    pcVar4 = "fd >= 0";
    uVar3 = 0x142;
  }
  else {
    unlink("/tmp/uv-test-sock");
    iVar2 = bind(iVar1,(sockaddr *)local_296,0x6e);
    if (iVar2 == 0) {
      iVar2 = listen(iVar1,1);
      if (iVar2 == 0) {
        iVar2 = uv_udp_init(uVar3,&handle);
        if (iVar2 == 0) {
          iVar2 = uv_udp_open(&handle,iVar1);
          if (iVar2 == 0) {
            uv_run(uVar3,0);
            iVar2 = uv_udp_send(&req,&handle,&buf,1,local_296,0);
            if (iVar2 == 0) {
              uv_close(&handle,0);
              uv_run(uVar3,0);
              close(iVar1);
              unlink("/tmp/uv-test-sock");
              loop = (uv_loop_t *)uv_default_loop();
              close_loop(loop);
              uVar3 = uv_default_loop();
              iVar1 = uv_loop_close(uVar3);
              if (iVar1 == 0) {
                return 0;
              }
              pcVar4 = "0 == uv_loop_close(uv_default_loop())";
              uVar3 = 0x15b;
            }
            else {
              pcVar4 = "r == 0";
              uVar3 = 0x154;
            }
          }
          else {
            pcVar4 = "r == 0";
            uVar3 = 0x14b;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0x149;
        }
      }
      else {
        pcVar4 = "0 == listen(fd, 1)";
        uVar3 = 0x146;
      }
    }
    else {
      pcVar4 = "0 == bind(fd, (const struct sockaddr*)&addr, sizeof addr)";
      uVar3 = 0x145;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-open.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(udp_send_unix) {
  /* Test that "uv_udp_send()" supports sending over
     a "sockaddr_un" address. */
  struct sockaddr_un addr;
  uv_udp_t handle;
  uv_udp_send_t req;
  uv_loop_t* loop;
  uv_buf_t buf = uv_buf_init("PING", 4);
  int fd;
  int r;

  loop = uv_default_loop();

  memset(&addr, 0, sizeof addr);
  addr.sun_family = AF_UNIX;
  ASSERT(strlen(TEST_PIPENAME) < sizeof(addr.sun_path));
  memcpy(addr.sun_path, TEST_PIPENAME, strlen(TEST_PIPENAME));

  fd = socket(AF_UNIX, SOCK_STREAM, 0);
  ASSERT(fd >= 0);

  unlink(TEST_PIPENAME);
  ASSERT(0 == bind(fd, (const struct sockaddr*)&addr, sizeof addr));
  ASSERT(0 == listen(fd, 1));

  r = uv_udp_init(loop, &handle);
  ASSERT(r == 0);
  r = uv_udp_open(&handle, fd);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  r = uv_udp_send(&req,
                  &handle,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  NULL);
  ASSERT(r == 0);

  uv_close((uv_handle_t*)&handle, NULL);
  uv_run(loop, UV_RUN_DEFAULT);
  close(fd);
  unlink(TEST_PIPENAME);

  MAKE_VALGRIND_HAPPY();
  return 0;
}